

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c49345::OptionBuilder::add(OptionBuilder *this,CoverageOptionSyntax *syntax)

{
  undefined1 *this_00;
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  long lVar2;
  Scope *this_01;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  uint64_t hash;
  Diagnostic *this_02;
  SourceLocation noteLocation;
  byte bVar10;
  not_null<slang::syntax::ExpressionSyntax_*> *args_2;
  ulong pos0;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>_>
  *pSVar14;
  undefined1 auVar15 [16];
  SourceRange sourceRange;
  try_emplace_args_t local_c1;
  string_view name;
  locator res;
  
  slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
  emplace_back<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
            (&(this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>,this->scope,
             syntax);
  name = slang::ast::CoverageOptionSetter::getName
                   ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ +
                    ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.len - 1
                    ));
  if (name._M_len != 0) {
    bVar8 = slang::ast::CoverageOptionSetter::isTypeOption
                      ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_
                       + ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.
                          len - 1));
    pSVar14 = &this->instNames;
    if (bVar8) {
      pSVar14 = &this->typeNames;
    }
    this_00 = &(pSVar14->super_Storage).field_0x68;
    args_2 = &syntax->expr;
    hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00,
                      &name);
    pos0 = hash >> (pSVar14->field_0x70 & 0x3f);
    lVar12 = (hash & 0xff) * 4;
    cVar4 = (&UNK_0050901c)[lVar12];
    cVar5 = (&UNK_0050901d)[lVar12];
    cVar6 = (&UNK_0050901e)[lVar12];
    bVar7 = (&UNK_0050901f)[lVar12];
    uVar11 = 0;
    uVar13 = pos0;
    do {
      lVar12 = *(long *)&pSVar14->field_0x80;
      pcVar1 = (char *)(lVar12 + uVar13 * 0x10);
      bVar10 = pcVar1[0xf];
      auVar15[0] = -(*pcVar1 == cVar4);
      auVar15[1] = -(pcVar1[1] == cVar5);
      auVar15[2] = -(pcVar1[2] == cVar6);
      auVar15[3] = -(pcVar1[3] == bVar7);
      auVar15[4] = -(pcVar1[4] == cVar4);
      auVar15[5] = -(pcVar1[5] == cVar5);
      auVar15[6] = -(pcVar1[6] == cVar6);
      auVar15[7] = -(pcVar1[7] == bVar7);
      auVar15[8] = -(pcVar1[8] == cVar4);
      auVar15[9] = -(pcVar1[9] == cVar5);
      auVar15[10] = -(pcVar1[10] == cVar6);
      auVar15[0xb] = -(pcVar1[0xb] == bVar7);
      auVar15[0xc] = -(pcVar1[0xc] == cVar4);
      auVar15[0xd] = -(pcVar1[0xd] == cVar5);
      auVar15[0xe] = -(pcVar1[0xe] == cVar6);
      auVar15[0xf] = -(bVar10 == bVar7);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
      if (uVar9 != 0) {
        lVar2 = *(long *)&pSVar14->field_0x88;
        do {
          uVar3 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          __y = (basic_string_view<char,_std::char_traits<char>_> *)
                (lVar2 + uVar13 * 0x168 + (ulong)uVar3 * 0x18);
          bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this_00,&name,__y);
          if (bVar8) {
            this_01 = this->scope;
            sourceRange = slang::syntax::SyntaxNode::sourceRange(&args_2->ptr->super_SyntaxNode);
            this_02 = slang::ast::Scope::addDiag(this_01,(DiagCode)0x220006,sourceRange);
            slang::Diagnostic::operator<<(this_02,name);
            res._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)__y[1]._M_len);
            noteLocation = slang::parsing::Token::location((Token *)&res);
            slang::Diagnostic::addNote(this_02,(DiagCode)0xc0001,noteLocation);
            return;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
        bVar10 = *(byte *)(lVar12 + uVar13 * 0x10 + 0xf);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar10) == 0) break;
      lVar12 = uVar13 + uVar11;
      uVar11 = uVar11 + 1;
      uVar13 = lVar12 + 1U & *(ulong *)&pSVar14->field_0x78;
    } while (uVar11 <= *(ulong *)&pSVar14->field_0x78);
    if (*(ulong *)&pSVar14->field_0x98 < *(ulong *)&pSVar14->field_0x90) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::not_null<slang::syntax::ExpressionSyntax*>const&>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
                       *)this_00,(arrays_type *)&pSVar14->field_0x70,pos0,hash,&local_c1,&name,
                 args_2);
      *(long *)&pSVar14->field_0x98 = *(long *)&pSVar14->field_0x98 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::not_null<slang::syntax::ExpressionSyntax*>const&>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
                       *)this_00,hash,&local_c1,&name,args_2);
    }
  }
  return;
}

Assistant:

void add(const CoverageOptionSyntax& syntax) {
        options.emplace_back(scope, syntax);

        if (auto name = options.back().getName(); !name.empty()) {
            auto names = options.back().isTypeOption() ? &typeNames : &instNames;
            auto [it, inserted] = names->emplace(name, syntax.expr);
            if (!inserted) {
                auto& diag = scope.addDiag(diag::CoverageOptionDup, syntax.expr->sourceRange());
                diag << name;
                diag.addNote(diag::NotePreviousUsage, it->second->getFirstToken().location());
            }
        }
    }